

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O1

void duckdb::
     TemplatedWritePlain<duckdb::interval_t,duckdb::ParquetIntervalTargetType,duckdb::ParquetIntervalOperator,false>
               (Vector *col,ColumnWriterStatistics *stats,idx_t chunk_start,idx_t chunk_end,
               ValidityMask *mask,WriteStream *ser)

{
  idx_t extraout_RDX;
  idx_t iVar1;
  data_ptr_t pdVar2;
  idx_t r;
  interval_t input;
  data_t local_40 [12];
  
  if (stats < chunk_start) {
    pdVar2 = col->data + (long)stats * 0x10 + 8;
    iVar1 = chunk_start;
    do {
      if ((*(long *)chunk_end == 0) ||
         ((*(ulong *)(*(long *)chunk_end + ((ulong)stats >> 6) * 8) >> ((ulong)stats & 0x3f) & 1) !=
          0)) {
        input.micros = iVar1;
        input._0_8_ = *(undefined8 *)pdVar2;
        local_40 = (data_t  [12])
                   ParquetIntervalOperator::
                   Operation<duckdb::interval_t,duckdb::ParquetIntervalTargetType>
                             (*(ParquetIntervalOperator **)(pdVar2 + -8),input);
        (*(code *)*(mask->super_TemplatedValidityMask<unsigned_long>).validity_mask)
                  (mask,local_40,0xc);
        iVar1 = extraout_RDX;
      }
      stats = (ColumnWriterStatistics *)((long)&stats->_vptr_ColumnWriterStatistics + 1);
      pdVar2 = pdVar2 + 0x10;
    } while ((ColumnWriterStatistics *)chunk_start != stats);
  }
  return;
}

Assistant:

static void TemplatedWritePlain(Vector &col, ColumnWriterStatistics *stats, const idx_t chunk_start,
                                const idx_t chunk_end, const ValidityMask &mask, WriteStream &ser) {
	static constexpr bool COPY_DIRECTLY_FROM_VECTOR =
	    ALL_VALID && std::is_same<SRC, TGT>::value && std::is_arithmetic<TGT>::value;

	const auto *const ptr = FlatVector::GetData<SRC>(col);

	TGT local_write[STANDARD_VECTOR_SIZE];
	idx_t local_write_count = 0;

	for (idx_t r = chunk_start; r < chunk_end; r++) {
		if (!ALL_VALID && !mask.RowIsValid(r)) {
			continue;
		}

		TGT target_value = OP::template Operation<SRC, TGT>(ptr[r]);
		OP::template HandleStats<SRC, TGT>(stats, target_value);

		if (COPY_DIRECTLY_FROM_VECTOR) {
			continue;
		}

		if (std::is_arithmetic<TGT>::value) {
			local_write[local_write_count++] = target_value;
			if (local_write_count == STANDARD_VECTOR_SIZE) {
				ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
				local_write_count = 0;
			}
		} else {
			OP::template WriteToStream<SRC, TGT>(target_value, ser);
		}
	}

	if (COPY_DIRECTLY_FROM_VECTOR) {
		ser.WriteData(const_data_ptr_cast(&ptr[chunk_start]), (chunk_end - chunk_start) * sizeof(TGT));
		return;
	}

	if (std::is_arithmetic<TGT>::value) {
		ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
	}
	// Else we already wrote to stream
}